

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

bool creat_daemon(string *name,bool to_null)

{
  bool bVar1;
  int iVar2;
  __pid_t pid;
  ulong uVar3;
  undefined8 uVar4;
  int noclose_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string pid_file_;
  bool to_null_local;
  string *name_local;
  
  DAT_001115e4 = 2;
  pid_file_.field_2._M_local_buf[0xf] = to_null;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_60,"/var/run/",name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,".pid");
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = is_exist((string *)local_40);
    if (bVar1) {
      uVar4 = std::__cxx11::string::c_str();
      zpsoe::zlog::_print_log
                (LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
                 ,0x56,"%s exists.",uVar4);
      name_local._7_1_ = false;
    }
    else {
      iVar2 = daemon(0,(uint)((pid_file_.field_2._M_local_buf[0xf] & 1U) == 0));
      if (iVar2 == 0) {
        pid = getpid();
        bVar1 = crt_pid_file(pid,(string *)local_40);
        if (bVar1) {
          name_local._7_1_ = true;
        }
        else {
          uVar4 = std::__cxx11::string::c_str();
          zpsoe::zlog::_print_log
                    (LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
                     ,99,"Cannot create pid file \'%s\'.",uVar4);
          name_local._7_1_ = false;
        }
      }
      else {
        uVar4 = std::__cxx11::string::c_str();
        zpsoe::zlog::_print_log
                  (LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
                   ,0x5d,"Cannot run %s in the background as system daemons.",uVar4);
        name_local._7_1_ = false;
      }
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,0x4f,"The daemon name is invalid.");
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool creat_daemon(const std::string &name, const bool to_null) {
    G_LogConfig.output_to = LOGOUTPUTSTREAM_STDERR;

    if (name.empty()) {
        print_log(LOG_ERROR, "The daemon name is invalid.");
        return false;
    }

    const std::string pid_file_("/var/run/" + name + ".pid");

    if (is_exist(pid_file_)) {
        print_log(LOG_ERROR, "%s exists.", pid_file_.c_str());
        return false;
    }

    const int noclose_(to_null ? 0 : 1);

    if (daemon(0, noclose_) != 0) {
        print_log(LOG_ERROR, "Cannot run %s in the background as system daemons.", name.c_str());
        return false;
    }

    // 在执行daemon函数之后获取的pid才是实际的子进程pid
    if (!crt_pid_file(getpid(), pid_file_)) {
        print_log(LOG_ERROR, "Cannot create pid file '%s'.", pid_file_.c_str());
        return false;
    }

    return true;
}